

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O0

char * ps_current_search(ps_decoder_t *ps)

{
  char *name;
  hash_iter_t *search_it;
  ps_decoder_t *ps_local;
  
  name = (char *)hash_table_iter(ps->searches);
  while( true ) {
    if (name == (char *)0x0) {
      return (char *)0x0;
    }
    if (*(ps_search_t **)(*(long *)(name + 8) + 0x10) == ps->search) break;
    name = (char *)hash_table_iter_next((hash_iter_t *)name);
  }
  return (char *)**(undefined8 **)(name + 8);
}

Assistant:

const char*
ps_current_search(ps_decoder_t *ps)
{
    hash_iter_t *search_it;
    const char* name = NULL;
    for (search_it = hash_table_iter(ps->searches); search_it;
        search_it = hash_table_iter_next(search_it)) {
        if (hash_entry_val(search_it->ent) == ps->search) {
            name = hash_entry_key(search_it->ent);
            break;
        }
    }
    return name;
}